

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathNumberFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr pxVar1;
  xmlChar *str;
  double val;
  xmlChar *content;
  double res;
  xmlXPathObjectPtr cur;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 0) {
      if (ctxt->context->node == (xmlNodePtr)0x0) {
        pxVar1 = xmlXPathCacheNewFloat(ctxt->context,0.0);
        valuePush(ctxt,pxVar1);
      }
      else {
        str = xmlNodeGetContent(ctxt->context->node);
        val = xmlXPathStringEvalNumber(str);
        pxVar1 = xmlXPathCacheNewFloat(ctxt->context,val);
        valuePush(ctxt,pxVar1);
        (*xmlFree)(str);
      }
    }
    else if (ctxt != (xmlXPathParserContextPtr)0x0) {
      if (nargs == 1) {
        if (ctxt->valueNr < ctxt->valueFrame + 1) {
          xmlXPathErr(ctxt,0x17);
        }
        else {
          pxVar1 = valuePop(ctxt);
          pxVar1 = xmlXPathCacheConvertNumber(ctxt->context,pxVar1);
          valuePush(ctxt,pxVar1);
        }
      }
      else {
        xmlXPathErr(ctxt,0xc);
      }
    }
  }
  return;
}

Assistant:

void
xmlXPathNumberFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;
    double res;

    if (ctxt == NULL) return;
    if (nargs == 0) {
	if (ctxt->context->node == NULL) {
	    valuePush(ctxt, xmlXPathCacheNewFloat(ctxt->context, 0.0));
	} else {
	    xmlChar* content = xmlNodeGetContent(ctxt->context->node);

	    res = xmlXPathStringEvalNumber(content);
	    valuePush(ctxt, xmlXPathCacheNewFloat(ctxt->context, res));
	    xmlFree(content);
	}
	return;
    }

    CHECK_ARITY(1);
    cur = valuePop(ctxt);
    valuePush(ctxt, xmlXPathCacheConvertNumber(ctxt->context, cur));
}